

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::CreateAppBundle(cmOSXBundleGenerator *this,string *targetName,string *outpath)

{
  cmGeneratorTarget *target;
  cmLocalGenerator *this_00;
  bool bVar1;
  char *pcVar2;
  string local_d0;
  undefined1 local_b0 [8];
  string plist;
  string newoutpath;
  undefined1 local_40 [8];
  string out;
  string *outpath_local;
  string *targetName_local;
  cmOSXBundleGenerator *this_local;
  
  out.field_2._8_8_ = outpath;
  bVar1 = MustSkip(this);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_40,(string *)out.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_40,"/");
    cmGeneratorTarget::GetAppBundleDirectory
              ((string *)((long)&newoutpath.field_2 + 8),this->GT,&this->ConfigName,false);
    std::__cxx11::string::operator+=
              ((string *)local_40,(string *)(newoutpath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(newoutpath.field_2._M_local_buf + 8));
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar2);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_40);
    std::__cxx11::string::string((string *)(plist.field_2._M_local_buf + 8),(string *)local_40);
    std::__cxx11::string::string((string *)local_b0,(string *)out.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_b0,"/");
    cmGeneratorTarget::GetAppBundleDirectory(&local_d0,this->GT,&this->ConfigName,true);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::operator+=((string *)local_b0,"/Info.plist");
    target = this->GT;
    this_00 = this->LocalGenerator;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmLocalGenerator::GenerateAppleInfoPList(this_00,target,targetName,pcVar2);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_b0);
    std::__cxx11::string::operator=
              ((string *)out.field_2._8_8_,(string *)(plist.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)(plist.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateAppBundle(const std::string& targetName,
                                           std::string& outpath)
{
  if (this->MustSkip())
    return;

  // Compute bundle directory names.
  std::string out = outpath;
  out += "/";
  out += this->GT->GetAppBundleDirectory(this->ConfigName, false);
  cmSystemTools::MakeDirectory(out.c_str());
  this->Makefile->AddCMakeOutputFile(out);

  std::string newoutpath = out;

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = outpath;
  plist += "/";
  plist += this->GT->GetAppBundleDirectory(this->ConfigName, true);
  plist += "/Info.plist";
  this->LocalGenerator->GenerateAppleInfoPList(this->GT,
                                               targetName,
                                               plist.c_str());
  this->Makefile->AddCMakeOutputFile(plist);
  outpath = newoutpath;
}